

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

size_type __thiscall
google::protobuf::internal::KeyMapBase<unsigned_long>::EraseImpl
          (KeyMapBase<unsigned_long> *this,map_index_t b,KeyNode *node,bool do_destroy)

{
  NodeBase **v1;
  Nullable<const_char_*> failure_msg;
  ulong uVar1;
  NodeAndBucket NVar2;
  uint local_4c;
  KeyNode *node_local;
  anon_class_24_3_6b4a2233 find_prev;
  LogMessageFatal local_28;
  
  find_prev.node = &node_local;
  local_4c = (this->super_UntypedMapBase).num_buckets_ - 1 & b;
  find_prev.b = &local_4c;
  node_local = node;
  find_prev.this = this;
  v1 = EraseImpl::anon_class_24_3_6b4a2233::operator()(&find_prev);
  if (*v1 == (NodeBase *)0x0) {
    NVar2 = FindHelper(this,(ViewType_conflict)node_local[1].super_NodeBase.next);
    local_4c = NVar2.bucket;
    v1 = EraseImpl::anon_class_24_3_6b4a2233::operator()(&find_prev);
  }
  failure_msg = absl::lts_20250127::log_internal::
                Check_EQImpl<google::protobuf::internal::NodeBase*,google::protobuf::internal::KeyNode<unsigned_long>*>
                          (v1,&node_local,"*prev == node");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    *v1 = (*v1)->next;
    (this->super_UntypedMapBase).num_elements_ = (this->super_UntypedMapBase).num_elements_ - 1;
    uVar1 = (ulong)local_4c;
    if (local_4c == (this->super_UntypedMapBase).index_of_first_non_null_) {
      while ((uVar1 < (this->super_UntypedMapBase).num_buckets_ &&
             ((this->super_UntypedMapBase).table_[uVar1] == (NodeBase *)0x0))) {
        uVar1 = uVar1 + 1;
        (this->super_UntypedMapBase).index_of_first_non_null_ = (map_index_t)uVar1;
      }
    }
    if (do_destroy && (this->super_UntypedMapBase).arena_ == (Arena *)0x0) {
      UntypedMapBase::DeleteNode(&this->super_UntypedMapBase,&node_local->super_NodeBase);
    }
    return 1;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
             ,0x2d4,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_28);
}

Assistant:

PROTOBUF_NOINLINE size_type EraseImpl(map_index_t b, KeyNode* node,
                                        bool do_destroy) {
    // Force bucket_index to be in range.
    b &= (num_buckets_ - 1);

    const auto find_prev = [&] {
      NodeBase** prev = table_ + b;
      for (; *prev != nullptr && *prev != node; prev = &(*prev)->next) {
      }
      return prev;
    };

    NodeBase** prev = find_prev();
    if (*prev == nullptr) {
      // The bucket index is wrong. The table was modified since the iterator
      // was made, so let's find the new bucket.
      b = FindHelper(TS::ToView(node->key())).bucket;
      prev = find_prev();
    }
    ABSL_DCHECK_EQ(*prev, node);
    *prev = (*prev)->next;

    --num_elements_;
    if (ABSL_PREDICT_FALSE(b == index_of_first_non_null_)) {
      while (index_of_first_non_null_ < num_buckets_ &&
             table_[index_of_first_non_null_] == nullptr) {
        ++index_of_first_non_null_;
      }
    }

    if (arena() == nullptr && do_destroy) {
      DeleteNode(node);
    }

    // To allow for the other overload of EraseImpl to do a tail call.
    return 1;
  }